

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transform.cc
# Opt level: O3

void __thiscall
pass_decouple_generator_ports_Test::TestBody(pass_decouple_generator_ports_Test *this)

{
  PassManager *pPVar1;
  _Rb_tree_header *p_Var2;
  Generator *this_00;
  Generator *this_01;
  Generator *pGVar3;
  Port *var;
  char *message;
  undefined1 local_270 [8];
  Context c;
  shared_ptr<kratos::Stmt> local_140;
  shared_ptr<kratos::Stmt> local_130;
  shared_ptr<kratos::Stmt> local_120;
  shared_ptr<kratos::Stmt> local_110;
  Port *local_100;
  Port *local_f8;
  Port *local_f0;
  Port *local_e8;
  Port *local_e0;
  internal local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  AssertHelper local_c0;
  undefined1 local_b8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  src;
  VerilogModule verilog;
  
  local_270 = (undefined1  [8])&c.modules_._M_h._M_rehash_policy._M_next_resize;
  c.modules_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.modules_._M_h._M_bucket_count = 0;
  c.modules_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.modules_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.modules_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.modules_._M_h._M_rehash_policy._4_4_ = 0;
  c.modules_._M_h._M_rehash_policy._M_next_resize = 0;
  c.modules_._M_h._M_single_bucket =
       (__node_base_ptr)&c.generator_hash_._M_h._M_rehash_policy._M_next_resize;
  c.generator_hash_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.generator_hash_._M_h._M_bucket_count = 0;
  c.generator_hash_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.generator_hash_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&c.enum_defs_;
  c.enum_defs_._M_t._M_impl._0_4_ = 0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  c.generator_hash_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.generator_hash_._M_h._M_rehash_policy._4_4_ = 0;
  c.generator_hash_._M_h._M_rehash_policy._M_next_resize = 0;
  c.generator_hash_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&c.empty_generators_._M_h._M_rehash_policy._M_next_resize;
  c.empty_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.empty_generators_._M_h._M_bucket_count = 0;
  c.empty_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.empty_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  c._224_8_ = &c.tracked_generators_._M_h._M_rehash_policy._M_next_resize;
  c.empty_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.empty_generators_._M_h._M_rehash_policy._4_4_ = 0;
  c.empty_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  c.empty_generators_._M_h._M_single_bucket._0_1_ = 0;
  c.tracked_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.tracked_generators_._M_h._M_bucket_count = 0;
  c.tracked_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.tracked_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.tracked_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.tracked_generators_._M_h._M_rehash_policy._4_4_ = 0;
  c.tracked_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  pPVar1 = &verilog.manager_;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,"module1","");
  this_00 = kratos::Context::generator
                      ((Context *)local_270,
                       (string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((PassManager *)src._M_t._M_impl.super__Rb_tree_header._M_node_count != pPVar1) {
    operator_delete((void *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    verilog.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,"in","");
  local_100 = kratos::Generator::port
                        (this_00,In,(string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         1,1);
  if ((PassManager *)src._M_t._M_impl.super__Rb_tree_header._M_node_count != pPVar1) {
    operator_delete((void *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    verilog.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,"out","");
  local_f8 = kratos::Generator::port
                       (this_00,Out,(string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        1,1);
  if ((PassManager *)src._M_t._M_impl.super__Rb_tree_header._M_node_count != pPVar1) {
    operator_delete((void *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    verilog.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,"module2","");
  this_01 = kratos::Context::generator
                      ((Context *)local_270,
                       (string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((PassManager *)src._M_t._M_impl.super__Rb_tree_header._M_node_count != pPVar1) {
    operator_delete((void *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    verilog.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,"in","");
  local_f0 = kratos::Generator::port
                       (this_01,In,(string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,1
                        ,1);
  if ((PassManager *)src._M_t._M_impl.super__Rb_tree_header._M_node_count != pPVar1) {
    operator_delete((void *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    verilog.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,"out","");
  local_e8 = kratos::Generator::port
                       (this_01,Out,(string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        1,1);
  if ((PassManager *)src._M_t._M_impl.super__Rb_tree_header._M_node_count != pPVar1) {
    operator_delete((void *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    verilog.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  kratos::Var::assign((Var *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      &local_e8->super_Var,(AssignmentType)local_f0);
  pGVar3 = verilog.generator_;
  c.tracked_generators_._M_h._M_single_bucket =
       (__node_base_ptr)src._M_t._M_impl.super__Rb_tree_header._M_node_count;
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  verilog.generator_ = (Generator *)0x0;
  kratos::Generator::add_stmt
            (this_01,(shared_ptr<kratos::Stmt> *)&c.tracked_generators_._M_h._M_single_bucket);
  if (pGVar3 != (Generator *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pGVar3);
  }
  if (verilog.generator_ != (Generator *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)verilog.generator_);
  }
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,"module3","");
  pGVar3 = kratos::Context::generator
                     ((Context *)local_270,
                      (string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((PassManager *)src._M_t._M_impl.super__Rb_tree_header._M_node_count != pPVar1) {
    operator_delete((void *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    verilog.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,"in","");
  var = kratos::Generator::port
                  (pGVar3,In,(string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,1,1);
  if ((PassManager *)src._M_t._M_impl.super__Rb_tree_header._M_node_count != pPVar1) {
    operator_delete((void *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    verilog.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,"out","");
  local_e0 = kratos::Generator::port
                       (pGVar3,Out,(string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,1
                        ,1);
  if ((PassManager *)src._M_t._M_impl.super__Rb_tree_header._M_node_count != pPVar1) {
    operator_delete((void *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    verilog.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  kratos::Var::assign((Var *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      &local_e0->super_Var,(AssignmentType)var);
  local_140.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)src._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_140.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)verilog.generator_;
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  verilog.generator_ = (Generator *)0x0;
  kratos::Generator::add_stmt(pGVar3,&local_140);
  if ((Generator *)
      local_140.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (Generator *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (verilog.generator_ != (Generator *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)verilog.generator_);
  }
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,"inst0","");
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_b8,
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &this_01->super_enable_shared_from_this<kratos::Generator>);
  kratos::Generator::add_child_generator
            (this_00,(string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (shared_ptr<kratos::Generator> *)local_b8);
  if (src._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src._M_t._M_impl._0_8_);
  }
  if ((PassManager *)src._M_t._M_impl.super__Rb_tree_header._M_node_count != pPVar1) {
    operator_delete((void *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    verilog.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,"inst1","");
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_b8,
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &pGVar3->super_enable_shared_from_this<kratos::Generator>);
  kratos::Generator::add_child_generator
            (this_00,(string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (shared_ptr<kratos::Generator> *)local_b8);
  if (src._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src._M_t._M_impl._0_8_);
  }
  if ((PassManager *)src._M_t._M_impl.super__Rb_tree_header._M_node_count != pPVar1) {
    operator_delete((void *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    verilog.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  kratos::Var::assign((Var *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      &local_f0->super_Var);
  local_130.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)src._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_130.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)verilog.generator_;
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  verilog.generator_ = (Generator *)0x0;
  kratos::Generator::add_stmt(this_00,&local_130);
  if ((Generator *)
      local_130.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (Generator *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (verilog.generator_ != (Generator *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)verilog.generator_);
  }
  kratos::Var::assign((Var *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,&var->super_Var);
  local_120.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)src._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_120.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)verilog.generator_;
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  verilog.generator_ = (Generator *)0x0;
  kratos::Generator::add_stmt(this_00,&local_120);
  if ((Generator *)
      local_120.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (Generator *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_120.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (verilog.generator_ != (Generator *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)verilog.generator_);
  }
  kratos::Var::operator+(&local_e8->super_Var,&local_e0->super_Var);
  kratos::Var::assign((Var *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      &local_f8->super_Var);
  local_110.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)src._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_110.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)verilog.generator_;
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  verilog.generator_ = (Generator *)0x0;
  kratos::Generator::add_stmt(this_00,&local_110);
  if ((Generator *)
      local_110.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (Generator *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (verilog.generator_ != (Generator *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)verilog.generator_);
  }
  kratos::VerilogModule::VerilogModule
            ((VerilogModule *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,this_00);
  p_Var2 = &src._M_t._M_impl.super__Rb_tree_header;
  local_b8 = (undefined1  [8])p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"fix_assignment_type","");
  kratos::PassManager::add_pass((PassManager *)&verilog,(string *)local_b8);
  if (local_b8 != (undefined1  [8])p_Var2) {
    operator_delete((void *)local_b8,src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  local_b8 = (undefined1  [8])p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"decouple_generator_ports","");
  kratos::PassManager::add_pass((PassManager *)&verilog,(string *)local_b8);
  if (local_b8 != (undefined1  [8])p_Var2) {
    operator_delete((void *)local_b8,src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  local_b8 = (undefined1  [8])p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"check_mixed_assignment","");
  kratos::PassManager::add_pass((PassManager *)&verilog,(string *)local_b8);
  if (local_b8 != (undefined1  [8])p_Var2) {
    operator_delete((void *)local_b8,src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  local_b8 = (undefined1  [8])p_Var2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"create_module_instantiation","");
  kratos::PassManager::add_pass((PassManager *)&verilog,(string *)local_b8);
  if (local_b8 != (undefined1  [8])p_Var2) {
    operator_delete((void *)local_b8,src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  local_b8 = (undefined1  [8])p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"hash_generators_parallel","");
  kratos::PassManager::add_pass((PassManager *)&verilog,(string *)local_b8);
  if (local_b8 != (undefined1  [8])p_Var2) {
    operator_delete((void *)local_b8,src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  kratos::VerilogModule::run_passes
            ((VerilogModule *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  kratos::VerilogModule::verilog_src_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_b8,(VerilogModule *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       src._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  local_c0.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_d8,"src.size()","3",(unsigned_long *)&local_c8,(int *)&local_c0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_transform.cc"
               ,0x70,message);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((_Base_ptr)local_c8._M_head_impl != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&verilog.manager_.passes_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
               *)&verilog);
  std::
  _Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&c.track_generated_);
  std::
  _Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
               *)&c.max_instance_id_);
  std::
  _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&c.modules_._M_h._M_single_bucket);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_270);
  return;
}

Assistant:

TEST(pass, decouple_generator_ports) {  // NOLINT
    Context c;
    auto &mod1 = c.generator("module1");
    auto &in1 = mod1.port(PortDirection::In, "in", 1);
    auto &out1 = mod1.port(PortDirection::Out, "out", 1);

    auto &mod2 = c.generator("module2");
    auto &in2 = mod2.port(PortDirection::In, "in", 1);
    auto &out2 = mod2.port(PortDirection::Out, "out", 1);
    mod2.add_stmt(out2.assign(in2, AssignmentType::Blocking));

    auto &mod3 = c.generator("module3");
    auto &in3 = mod3.port(PortDirection::In, "in", 1);
    auto &out3 = mod3.port(PortDirection::Out, "out", 1);
    mod3.add_stmt(out3.assign(in3, AssignmentType::Blocking));

    mod1.add_child_generator("inst0", mod2.shared_from_this());
    mod1.add_child_generator("inst1", mod3.shared_from_this());

    mod1.add_stmt(in2.assign(in1));
    mod1.add_stmt(in3.assign(in1));

    mod1.add_stmt(out1.assign(out2 + out3));

    VerilogModule verilog(&mod1);
    PassManager &manager = verilog.pass_manager();
    manager.add_pass("fix_assignment_type");
    manager.add_pass("decouple_generator_ports");
    manager.add_pass("check_mixed_assignment");
    manager.add_pass("create_module_instantiation");
    manager.add_pass("hash_generators_parallel");
    verilog.run_passes();
    auto src = verilog.verilog_src();
    EXPECT_EQ(src.size(), 3);
}